

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTransaction::SetTxOutValue
          (ConfidentialTransaction *this,uint32_t index,Amount *value)

{
  bool bVar1;
  reference pvVar2;
  CfdException *pCVar3;
  uchar *puVar4;
  size_type sVar5;
  void *pvVar6;
  undefined8 uVar7;
  bool bVar8;
  string *in_stack_fffffffffffffe70;
  string *message;
  undefined8 in_stack_fffffffffffffe78;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe80;
  CfdException *this_00;
  undefined1 local_141 [33];
  CfdSourceLocation local_120;
  ByteData local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value_data;
  ConfidentialValue ct_value;
  allocator local_91;
  string local_90 [32];
  CfdSourceLocation local_70;
  ConfidentialValue local_58;
  uchar *local_30;
  wally_tx_output *output;
  wally_tx *tx_pointer;
  Amount *value_local;
  ConfidentialTransaction *pCStack_10;
  uint32_t index_local;
  ConfidentialTransaction *this_local;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  tx_pointer = (wally_tx *)value;
  value_local._4_4_ = index;
  pCStack_10 = this;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
            (this,(ulong)index,0x8d6,"SetTxOutValue");
  output = (wally_tx_output *)(this->super_AbstractTransaction).wally_tx_pointer_;
  if (output != (wally_tx_output *)0x0) {
    local_30 = output->asset + (ulong)value_local._4_4_ * 0x70;
    pvVar2 = ::std::
             vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
             operator[](&this->vout_,(ulong)value_local._4_4_);
    ConfidentialTxOut::GetConfidentialValue(&local_58,pvVar2);
    bVar1 = ConfidentialValue::HasBlinding(&local_58);
    bVar8 = true;
    if (!bVar1) {
      bVar8 = *(long *)(local_30 + 0x38) == 0x21;
    }
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4b0996);
    if (bVar8) {
      local_70.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_70.filename = local_70.filename + 1;
      local_70.line = 0x8de;
      local_70.funcname = "SetTxOutValue";
      logger::warn<>(&local_70,"value is already blinded.");
      ct_value._35_1_ = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_90,"value is already blinded.",&local_91);
      CfdException::CfdException(in_stack_fffffffffffffe80,error_code,in_stack_fffffffffffffe70);
      ct_value._35_1_ = 0;
      __cxa_throw(uVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ConfidentialValue::ConfidentialValue((ConfidentialValue *)&value_data,(Amount *)tx_pointer);
    ConfidentialValue::GetData(&local_108,(ConfidentialValue *)&value_data);
    ByteData::GetBytes(&local_f0,&local_108);
    ByteData::~ByteData((ByteData *)0x4b0b14);
    local_d8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0;
    this_00 = *(CfdException **)(local_30 + 0x38);
    pCVar3 = (CfdException *)
             ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_d8);
    if (this_00 == pCVar3) {
      pvVar6 = *(void **)(local_30 + 0x30);
      puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_d8);
      memcpy(pvVar6,puVar4,*(size_t *)(local_30 + 0x38));
    }
    else {
      if (*(long *)(local_30 + 0x30) != 0) {
        free(*(void **)(local_30 + 0x30));
      }
      sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_d8);
      pvVar6 = malloc(sVar5);
      *(void **)(local_30 + 0x30) = pvVar6;
      if (*(long *)(local_30 + 0x30) == 0) {
        local_120.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                     ,0x2f);
        local_120.filename = local_120.filename + 1;
        local_120.line = 0x8ea;
        local_120.funcname = "SetTxOutValue";
        logger::warn<>(&local_120,"malloc fail.");
        uVar7 = __cxa_allocate_exception(0x30);
        message = (string *)local_141;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)(local_141 + 1),"malloc fail.",(allocator *)message);
        CfdException::CfdException(this_00,error_code,message);
        __cxa_throw(uVar7,&CfdException::typeinfo,CfdException::~CfdException);
      }
      sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_d8);
      *(size_type *)(local_30 + 0x38) = sVar5;
      pvVar6 = *(void **)(local_30 + 0x30);
      puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_d8);
      memcpy(pvVar6,puVar4,*(size_t *)(local_30 + 0x38));
    }
    pvVar2 = ::std::
             vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
             operator[](&this->vout_,(ulong)value_local._4_4_);
    (*(pvVar2->super_AbstractTxOut)._vptr_AbstractTxOut[2])(pvVar2,tx_pointer);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe70);
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4b0dcb);
  }
  return;
}

Assistant:

void ConfidentialTransaction::SetTxOutValue(
    uint32_t index, const Amount &value) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer != nullptr) {
    struct wally_tx_output *output = tx_pointer->outputs + index;
    if (vout_[index].GetConfidentialValue().HasBlinding() ||
        (output->value_len == kConfidentialDataSize)) {
      warn(CFD_LOG_SOURCE, "value is already blinded.");
      throw CfdException(kCfdIllegalStateError, "value is already blinded.");
    }

    ConfidentialValue ct_value(value);
    const std::vector<uint8_t> &value_data = ct_value.GetData().GetBytes();
    if (output->value_len == value_data.size()) {
      memcpy(output->value, value_data.data(), output->value_len);
    } else {
      if (output->value != nullptr) free(output->value);
      output->value = (unsigned char *)malloc(value_data.size());
      if (output->value == nullptr) {
        warn(CFD_LOG_SOURCE, "malloc fail.");
        throw CfdException(kCfdMemoryFullError, "malloc fail.");
      }
      output->value_len = value_data.size();
      memcpy(output->value, value_data.data(), output->value_len);
    }

    vout_[index].SetValue(value);
    // CallbackStateChange(kStateChangeAddTxOut);
  }
}